

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::FileDescriptorProto::InternalSwap
          (FileDescriptorProto *this,FileDescriptorProto *other)

{
  InternalMetadata *this_00;
  ArenaStringPtr *pAVar1;
  uint32 uVar2;
  string *psVar3;
  FileOptions *pFVar4;
  SourceCodeInfo *pSVar5;
  SourceCodeInfo *pSVar6;
  UnknownFieldSet *other_00;
  Arena *pAVar7;
  ArenaStringPtr *pAVar8;
  
  this_00 = &(other->super_Message).super_MessageLite._internal_metadata_;
  if ((((ulong)(this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) != 0) ||
     (((ulong)this_00->ptr_ & 1) != 0)) {
    if (((ulong)this_00->ptr_ & 1) == 0) {
      other_00 = internal::InternalMetadata::
                 mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
    }
    else {
      other_00 = (UnknownFieldSet *)(((ulong)this_00->ptr_ & 0xfffffffffffffffe) + 8);
    }
    internal::InternalMetadata::DoSwap<google::protobuf::UnknownFieldSet>
              (&(this->super_Message).super_MessageLite._internal_metadata_,other_00);
  }
  uVar2 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar2;
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->dependency_).super_RepeatedPtrFieldBase,
             &(other->dependency_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->message_type_).super_RepeatedPtrFieldBase,
             &(other->message_type_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->enum_type_).super_RepeatedPtrFieldBase,
             &(other->enum_type_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->service_).super_RepeatedPtrFieldBase,
             &(other->service_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->extension_).super_RepeatedPtrFieldBase,
             &(other->extension_).super_RepeatedPtrFieldBase);
  RepeatedField<int>::InternalSwap(&this->public_dependency_,&other->public_dependency_);
  RepeatedField<int>::InternalSwap(&this->weak_dependency_,&other->weak_dependency_);
  pAVar1 = &this->name_;
  pAVar7 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar7 & 1) != 0) {
    pAVar7 = *(Arena **)((ulong)pAVar7 & 0xfffffffffffffffe);
  }
  pAVar8 = &other->name_;
  if (pAVar1->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar8->ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar1,pAVar7,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      goto LAB_00298d90;
    }
  }
  else {
LAB_00298d90:
    psVar3 = pAVar1->ptr_;
    if (pAVar8->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar8,pAVar7,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::swap((string *)psVar3);
  }
  pAVar1 = &this->package_;
  pAVar7 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar7 & 1) != 0) {
    pAVar7 = *(Arena **)((ulong)pAVar7 & 0xfffffffffffffffe);
  }
  pAVar8 = &other->package_;
  if (pAVar1->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar8->ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar1,pAVar7,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      goto LAB_00298de9;
    }
  }
  else {
LAB_00298de9:
    psVar3 = pAVar1->ptr_;
    if (pAVar8->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar8,pAVar7,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::swap((string *)psVar3);
  }
  pAVar1 = &this->syntax_;
  pAVar7 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar7 & 1) != 0) {
    pAVar7 = *(Arena **)((ulong)pAVar7 & 0xfffffffffffffffe);
  }
  pAVar8 = &other->syntax_;
  if (pAVar1->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar8->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_)
    goto LAB_00298e6f;
    internal::ArenaStringPtr::CreateInstance
              (pAVar1,pAVar7,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  }
  psVar3 = pAVar1->ptr_;
  if (pAVar8->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstance
              (pAVar8,pAVar7,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  }
  std::__cxx11::string::swap((string *)psVar3);
LAB_00298e6f:
  pFVar4 = this->options_;
  pSVar5 = this->source_code_info_;
  pSVar6 = other->source_code_info_;
  this->options_ = other->options_;
  this->source_code_info_ = pSVar6;
  other->options_ = pFVar4;
  other->source_code_info_ = pSVar5;
  return;
}

Assistant:

void FileDescriptorProto::InternalSwap(FileDescriptorProto* other) {
  using std::swap;
  _internal_metadata_.Swap<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  dependency_.InternalSwap(&other->dependency_);
  message_type_.InternalSwap(&other->message_type_);
  enum_type_.InternalSwap(&other->enum_type_);
  service_.InternalSwap(&other->service_);
  extension_.InternalSwap(&other->extension_);
  public_dependency_.InternalSwap(&other->public_dependency_);
  weak_dependency_.InternalSwap(&other->weak_dependency_);
  name_.Swap(&other->name_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  package_.Swap(&other->package_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  syntax_.Swap(&other->syntax_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(FileDescriptorProto, source_code_info_)
      + sizeof(FileDescriptorProto::source_code_info_)
      - PROTOBUF_FIELD_OFFSET(FileDescriptorProto, options_)>(
          reinterpret_cast<char*>(&options_),
          reinterpret_cast<char*>(&other->options_));
}